

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

void Fossilize::filter_feature_enablement
               (VkPhysicalDeviceFeatures2 *pdf,VulkanFeatures *features,
               VkPhysicalDeviceFeatures2 *target_features,char **active_extensions,
               size_t *out_extension_count)

{
  size_t *out_extension_count_local;
  char **active_extensions_local;
  VkPhysicalDeviceFeatures2 *target_features_local;
  VulkanFeatures *features_local;
  VkPhysicalDeviceFeatures2 *pdf_local;
  
  filter_feature_enablement(pdf,features,target_features);
  filter_active_extensions(pdf,active_extensions,out_extension_count);
  return;
}

Assistant:

void filter_feature_enablement(VkPhysicalDeviceFeatures2 &pdf,
                               VulkanFeatures &features,
                               const VkPhysicalDeviceFeatures2 *target_features,
							   const char **active_extensions, size_t *out_extension_count)
{
	filter_feature_enablement(pdf, features, target_features);
	filter_active_extensions(pdf, active_extensions, out_extension_count);
}